

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_scaling_square.c
# Opt level: O2

int16_t WebRtcSpl_GetScalingSquare(int16_t *in_vector,size_t in_vector_length,size_t times)

{
  int iVar1;
  short sVar2;
  uint uVar3;
  size_t sVar4;
  int16_t smax;
  uint uVar5;
  size_t looptimes;
  short sVar6;
  int16_t *sptr;
  ushort uVar7;
  
  uVar5 = (uint)times;
  smax = -1;
  for (sVar4 = 0; in_vector_length != sVar4; sVar4 = sVar4 + 1) {
    sVar6 = in_vector[sVar4];
    sVar2 = -sVar6;
    if (0 < sVar6) {
      sVar2 = sVar6;
    }
    if (smax < sVar2) {
      smax = sVar2;
    }
  }
  uVar3 = (int)smax * (int)smax;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar6 = ((ushort)iVar1 ^ 0x1f) - 1;
  if (smax == 0) {
    sVar6 = 0;
  }
  uVar7 = 0x20;
  if (uVar5 != 0) {
    iVar1 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar7 = (ushort)iVar1 ^ 0x1f;
  }
  sVar2 = (0x20 - uVar7) - sVar6;
  if ((short)(0x20 - uVar7) < sVar6) {
    sVar2 = 0;
  }
  if (smax == 0) {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

int16_t WebRtcSpl_GetScalingSquare(int16_t* in_vector,
                                   size_t in_vector_length,
                                   size_t times)
{
    int16_t nbits = WebRtcSpl_GetSizeInBits((uint32_t)times);
    size_t i;
    int16_t smax = -1;
    int16_t sabs;
    int16_t *sptr = in_vector;
    int16_t t;
    size_t looptimes = in_vector_length;

    for (i = looptimes; i > 0; i--)
    {
        sabs = (*sptr > 0 ? *sptr++ : -*sptr++);
        smax = (sabs > smax ? sabs : smax);
    }
    t = WebRtcSpl_NormW32(WEBRTC_SPL_MUL(smax, smax));

    if (smax == 0)
    {
        return 0; // Since norm(0) returns 0
    } else
    {
        return (t > nbits) ? 0 : nbits - t;
    }
}